

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlParseContentInternal(htmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  xmlParserInputPtr pxVar3;
  __int32_t *p_Var4;
  xmlChar *pxVar5;
  endElementSAXFunc p_Var6;
  int iVar7;
  int iVar8;
  xmlChar *str1;
  xmlChar *pxVar9;
  __int32_t **pp_Var10;
  long lVar11;
  htmlParserNodeInfo local_58;
  
  str1 = xmlStrdup(ctxt->name);
  iVar8 = ctxt->nameNr;
LAB_0014c08c:
  if ((ctxt->progressive == 0) &&
     (pxVar3 = ctxt->input, (long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserInputGrow(pxVar3,0xfa);
  }
  if (ctxt->instate == XML_PARSER_EOF) goto LAB_0014c5dd;
  pxVar9 = ctxt->input->cur;
  if (*pxVar9 != '<') goto LAB_0014c135;
  if (pxVar9[1] == '/') goto LAB_0014c29a;
  bVar1 = pxVar9[1];
  if ((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x3a)) {
    pxVar9 = htmlParseHTMLName_nonInvasive(ctxt);
    if (pxVar9 != (xmlChar *)0x0) {
      if ((ctxt->name == (xmlChar *)0x0) ||
         (iVar7 = htmlCheckAutoClose(pxVar9,ctxt->name), iVar7 == 0)) goto LAB_0014c135;
      htmlAutoClose(ctxt,pxVar9);
      goto LAB_0014c08c;
    }
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseStartTag: invalid element name\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    while (*ctxt->input->cur == '\0') {
      xmlNextChar(ctxt);
    }
  }
  else {
LAB_0014c135:
    if (((ctxt->nameNr < 1) || (iVar8 < ctxt->nameNr)) ||
       (iVar7 = xmlStrEqual(str1,ctxt->name), iVar7 != 0)) {
      if ((*ctxt->input->cur == '\0') ||
         ((iVar7 = xmlStrEqual(str1,"script"), iVar7 == 0 &&
          (iVar7 = xmlStrEqual(str1,"style"), iVar7 == 0)))) {
        pxVar9 = ctxt->input->cur;
        if ((*pxVar9 == '<') && (pxVar9[1] == '!')) {
          pp_Var10 = __ctype_toupper_loc();
          p_Var4 = *pp_Var10;
          if (((((p_Var4[pxVar9[2]] == 0x44) && (p_Var4[pxVar9[3]] == 0x4f)) &&
               (p_Var4[pxVar9[4]] == 0x43)) &&
              ((p_Var4[pxVar9[5]] == 0x54 && (p_Var4[pxVar9[6]] == 0x59)))) &&
             ((p_Var4[pxVar9[7]] == 0x50 && (p_Var4[pxVar9[8]] == 0x45)))) {
            htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                         (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
            htmlParseDocTypeDecl(ctxt);
          }
        }
        pxVar3 = ctxt->input;
        pxVar9 = pxVar3->cur;
        xVar2 = *pxVar9;
        if (xVar2 == '<') {
          if (((pxVar9[1] == '!') && (pxVar9[2] == '-')) && (pxVar9[3] == '-')) {
            htmlParseComment(ctxt);
          }
          else {
            if (pxVar9[1] != '?') goto LAB_0014c33a;
            htmlParsePI(ctxt);
          }
        }
        else {
LAB_0014c33a:
          if (xVar2 == '&') {
            htmlParseReference(ctxt);
          }
          else if (xVar2 == '<') {
            local_58.begin_line = 0;
            local_58.end_pos = 0;
            local_58.node = (_xmlNode *)0x0;
            local_58.begin_pos = 0;
            local_58.end_line = 0;
            if (pxVar3 == (xmlParserInputPtr)0x0) {
              htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseElementInternal: context error\n",
                           (xmlChar *)0x0,(xmlChar *)0x0);
            }
            else if (ctxt->instate != XML_PARSER_EOF) {
              if (ctxt->record_info != 0) {
                local_58.begin_pos =
                     (unsigned_long)(pxVar9 + (pxVar3->consumed - (long)pxVar3->base));
                local_58.begin_line = (unsigned_long)pxVar3->line;
              }
              iVar8 = htmlParseStartTag(ctxt);
              pxVar9 = ctxt->name;
              if (pxVar9 == (xmlChar *)0x0 || iVar8 == -1) {
                if (*ctxt->input->cur == '>') {
                  xmlNextChar(ctxt);
                }
              }
              else {
                lVar11 = 0;
                do {
                  iVar8 = xmlStrcasecmp(pxVar9,*(xmlChar **)
                                                ((long)&html40ElementTable[0].name + lVar11));
                  if (iVar8 == 0) {
                    lVar11 = (long)&html40ElementTable[0].name + lVar11;
                    goto LAB_0014c456;
                  }
                  lVar11 = lVar11 + 0x40;
                } while (lVar11 != 0x1700);
                lVar11 = 0;
LAB_0014c456:
                if (lVar11 == 0) {
                  htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar9,(xmlChar *)0x0);
                }
                pxVar3 = ctxt->input;
                pxVar5 = pxVar3->cur;
                if (*pxVar5 == '>') {
                  xmlNextChar(ctxt);
                  if ((lVar11 != 0) && (*(char *)(lVar11 + 0xb) != '\0')) goto LAB_0014c4bf;
                  if (ctxt->record_info != 0) {
                    htmlNodeInfoPush(ctxt,&local_58);
                  }
                }
                else if ((*pxVar5 == '/') && (pxVar5[1] == '>')) {
                  pxVar3->cur = pxVar5 + 2;
                  pxVar3->col = pxVar3->col + 2;
LAB_0014c4bf:
                  if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                     (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
                    (*p_Var6)(ctxt->userData,pxVar9);
                  }
                  iVar8 = ctxt->nameNr;
                  lVar11 = (long)iVar8;
                  if (0 < lVar11) {
                    ctxt->nameNr = iVar8 + -1;
                    if (iVar8 == 1) {
                      pxVar9 = (xmlChar *)0x0;
                    }
                    else {
                      pxVar9 = ctxt->nameTab[lVar11 + -2];
                    }
                    ctxt->name = pxVar9;
                    ctxt->nameTab[lVar11 + -1] = (xmlChar *)0x0;
                  }
                }
                else {
                  htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",
                               pxVar9,(xmlChar *)0x0);
                  iVar8 = xmlStrEqual(pxVar9,ctxt->name);
                  if (iVar8 != 0) {
                    nodePop(ctxt);
                    iVar8 = ctxt->nameNr;
                    lVar11 = (long)iVar8;
                    if (0 < lVar11) {
                      ctxt->nameNr = iVar8 + -1;
                      if (iVar8 == 1) {
                        pxVar9 = (xmlChar *)0x0;
                      }
                      else {
                        pxVar9 = ctxt->nameTab[lVar11 + -2];
                      }
                      ctxt->name = pxVar9;
                      ctxt->nameTab[lVar11 + -1] = (xmlChar *)0x0;
                    }
                  }
                  if (ctxt->record_info != 0) {
                    htmlNodeInfoPush(ctxt,&local_58);
                  }
                  htmlParserFinishElementParsing(ctxt);
                }
              }
            }
            if (str1 != (xmlChar *)0x0) {
              (*xmlFree)(str1);
            }
            str1 = xmlStrdup(ctxt->name);
            iVar8 = ctxt->nameNr;
          }
          else {
            if (xVar2 == '\0') {
              htmlAutoCloseOnEnd(ctxt);
LAB_0014c5dd:
              if (str1 == (xmlChar *)0x0) {
                return;
              }
              (*xmlFree)(str1);
              return;
            }
            htmlParseCharDataInternal(ctxt,0);
          }
        }
      }
      else {
        htmlParseScript(ctxt);
      }
      if ((ctxt->progressive == 0) &&
         (pxVar3 = ctxt->input, (long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
        xmlParserInputGrow(pxVar3,0xfa);
      }
      goto LAB_0014c08c;
    }
  }
  htmlParserFinishElementParsing(ctxt);
  if (str1 != (xmlChar *)0x0) goto LAB_0014c301;
  goto LAB_0014c307;
LAB_0014c29a:
  iVar7 = htmlParseEndTag(ctxt);
  if (iVar7 != 0) {
    if (str1 == (xmlChar *)0x0) {
      str1 = (xmlChar *)0x0;
      if (ctxt->nameNr != 0) goto LAB_0014c08c;
    }
    else {
LAB_0014c301:
      (*xmlFree)(str1);
    }
LAB_0014c307:
    str1 = xmlStrdup(ctxt->name);
    iVar8 = ctxt->nameNr;
  }
  goto LAB_0014c08c;
}

Assistant:

static void
htmlParseContentInternal(htmlParserCtxtPtr ctxt) {
    xmlChar *currentNode;
    int depth;
    const xmlChar *name;

    currentNode = xmlStrdup(ctxt->name);
    depth = ctxt->nameNr;
    while (1) {
        GROW;

        if (ctxt->instate == XML_PARSER_EOF)
            break;

	/*
	 * Our tag or one of it's parent or children is ending.
	 */
        if ((CUR == '<') && (NXT(1) == '/')) {
	    if (htmlParseEndTag(ctxt) &&
		((currentNode != NULL) || (ctxt->nameNr == 0))) {
		if (currentNode != NULL)
		    xmlFree(currentNode);

	        currentNode = xmlStrdup(ctxt->name);
	        depth = ctxt->nameNr;
	    }
	    continue; /* while */
        }

	else if ((CUR == '<') &&
	         ((IS_ASCII_LETTER(NXT(1))) ||
		  (NXT(1) == '_') || (NXT(1) == ':'))) {
	    name = htmlParseHTMLName_nonInvasive(ctxt);
	    if (name == NULL) {
	        htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
			 "htmlParseStartTag: invalid element name\n",
			 NULL, NULL);
	        /* Dump the bogus tag like browsers do */
	        while ((CUR == 0) && (CUR != '>'))
	            NEXT;

	        htmlParserFinishElementParsing(ctxt);
	        if (currentNode != NULL)
	            xmlFree(currentNode);

	        currentNode = xmlStrdup(ctxt->name);
	        depth = ctxt->nameNr;
	        continue;
	    }

	    if (ctxt->name != NULL) {
	        if (htmlCheckAutoClose(name, ctxt->name) == 1) {
	            htmlAutoClose(ctxt, name);
	            continue;
	        }
	    }
	}

	/*
	 * Has this node been popped out during parsing of
	 * the next element
	 */
        if ((ctxt->nameNr > 0) && (depth >= ctxt->nameNr) &&
	    (!xmlStrEqual(currentNode, ctxt->name)))
	     {
	    htmlParserFinishElementParsing(ctxt);
	    if (currentNode != NULL) xmlFree(currentNode);

	    currentNode = xmlStrdup(ctxt->name);
	    depth = ctxt->nameNr;
	    continue;
	}

	if ((CUR != 0) && ((xmlStrEqual(currentNode, BAD_CAST"script")) ||
	    (xmlStrEqual(currentNode, BAD_CAST"style")))) {
	    /*
	     * Handle SCRIPT/STYLE separately
	     */
	    htmlParseScript(ctxt);
	} else {
	    /*
	     * Sometimes DOCTYPE arrives in the middle of the document
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(UPP(2) == 'D') && (UPP(3) == 'O') &&
		(UPP(4) == 'C') && (UPP(5) == 'T') &&
		(UPP(6) == 'Y') && (UPP(7) == 'P') &&
		(UPP(8) == 'E')) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "Misplaced DOCTYPE declaration\n",
			     BAD_CAST "DOCTYPE" , NULL);
		htmlParseDocTypeDecl(ctxt);
	    }

	    /*
	     * First case :  a comment
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(NXT(2) == '-') && (NXT(3) == '-')) {
		htmlParseComment(ctxt);
	    }

	    /*
	     * Second case : a Processing Instruction.
	     */
	    else if ((CUR == '<') && (NXT(1) == '?')) {
		htmlParsePI(ctxt);
	    }

	    /*
	     * Third case :  a sub-element.
	     */
	    else if (CUR == '<') {
		htmlParseElementInternal(ctxt);
		if (currentNode != NULL) xmlFree(currentNode);

		currentNode = xmlStrdup(ctxt->name);
		depth = ctxt->nameNr;
	    }

	    /*
	     * Fourth case : a reference. If if has not been resolved,
	     *    parsing returns it's Name, create the node
	     */
	    else if (CUR == '&') {
		htmlParseReference(ctxt);
	    }

	    /*
	     * Fifth case : end of the resource
	     */
	    else if (CUR == 0) {
		htmlAutoCloseOnEnd(ctxt);
		break;
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		htmlParseCharData(ctxt);
	    }
	}
        GROW;
    }
    if (currentNode != NULL) xmlFree(currentNode);
}